

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabelPrivate::ensureTextControl(QLabelPrivate *this)

{
  QWidget *this_00;
  QWidgetTextControl *pQVar1;
  void **ppvVar2;
  bool focus;
  QWidgetTextControl *pQVar3;
  QTextDocument *pQVar4;
  QPalette *pal;
  undefined4 *puVar5;
  long in_FS_OFFSET;
  QObject local_70 [8];
  Connection local_68;
  Connection local_60;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->field_0x340 & 0x10) != 0) && (this->control == (QWidgetTextControl *)0x0)) {
    this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
    pQVar3 = (QWidgetTextControl *)operator_new(0x18);
    QWidgetTextControl::QWidgetTextControl(pQVar3,&this_00->super_QObject);
    this->control = (QWidgetTextControl *)pQVar3;
    pQVar4 = QWidgetTextControl::document(pQVar3);
    QTextDocument::setUndoRedoEnabled(SUB81(pQVar4,0));
    pQVar4 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
    QTextDocument::setDefaultFont((QFont *)pQVar4);
    if ((this->resourceProvider).super__Function_base._M_manager != (_Manager_type)0x0) {
      pQVar4 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
      QTextDocument::setResourceProvider((function *)pQVar4);
    }
    QWidgetTextControl::setTextInteractionFlags
              ((QWidgetTextControl *)this->control,
               (TextInteractionFlags)
               (this->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
               super_QFlagsStorage<Qt::TextInteractionFlag>.i);
    QWidgetTextControl::setOpenExternalLinks
              ((QWidgetTextControl *)this->control,(bool)(this->field_0x341 & 1));
    pQVar3 = (QWidgetTextControl *)this->control;
    pal = QWidget::palette(this_00);
    QWidgetTextControl::setPalette(pQVar3,pal);
    pQVar3 = (QWidgetTextControl *)this->control;
    focus = QWidget::hasFocus(this_00);
    QWidgetTextControl::setFocus(pQVar3,focus,OtherFocusReason);
    pQVar1 = this->control;
    local_58 = QWidget::update;
    local_50 = (ImplFn)0x0;
    local_48 = QWidgetTextControl::updateRequest;
    local_40 = 0;
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::QCallableObject<void_(QWidget::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar5 + 4) = QWidget::update;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_60,(void **)pQVar1,(QObject *)&local_48,(void **)this_00,
               (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_60);
    pQVar1 = this->control;
    local_58 = QLabel::linkActivated;
    local_50 = (ImplFn)0x0;
    local_48 = QWidgetTextControl::linkActivated;
    local_40 = 0;
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QCallableObject<void_(QLabel::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
         ::impl;
    *(code **)(puVar5 + 4) = QLabel::linkActivated;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_68,(void **)pQVar1,(QObject *)&local_48,(void **)this_00,
               (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_68);
    pQVar1 = this->control;
    local_48 = QWidgetTextControl::linkHovered;
    local_40 = 0;
    local_58 = linkHovered;
    local_50 = (ImplFn)0x0;
    ppvVar2 = *(void ***)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QLabelPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
         ::impl;
    *(code **)(puVar5 + 4) = linkHovered;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              (local_70,(void **)pQVar1,(QObject *)&local_48,ppvVar2,(QSlotObjectBase *)&local_58,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_70);
    this->field_0x340 = this->field_0x340 | 0xc;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::ensureTextControl() const
{
    Q_Q(const QLabel);
    if (!isTextLabel)
        return;
    if (!control) {
        control = new QWidgetTextControl(const_cast<QLabel *>(q));
        control->document()->setUndoRedoEnabled(false);
        control->document()->setDefaultFont(q->font());
        if (resourceProvider != nullptr)
            control->document()->setResourceProvider(resourceProvider);
        control->setTextInteractionFlags(textInteractionFlags);
        control->setOpenExternalLinks(openExternalLinks);
        control->setPalette(q->palette());
        control->setFocus(q->hasFocus());
        QObject::connect(control, &QWidgetTextControl::updateRequest,
                         q, qOverload<>(&QLabel::update));
        QObject::connect(control, &QWidgetTextControl::linkActivated,
                         q, &QLabel::linkActivated);
        QObjectPrivate::connect(control, &QWidgetTextControl::linkHovered,
                                this, &QLabelPrivate::linkHovered);
        textLayoutDirty = true;
        textDirty = true;
    }
}